

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

int try_preparse_cmd(voccxdef *ctx,char **cmd,int wrdcnt,uchar **preparse_list)

{
  char cVar1;
  long lVar2;
  int iVar3;
  undefined1 *puVar4;
  undefined8 *in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  bool bVar5;
  errdef fr_;
  int add_quote;
  char *src;
  int err;
  int typ;
  runsdef val;
  size_t len;
  uchar *p;
  int i;
  uchar listbuf [514];
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  errcxdef *in_stack_fffffffffffffc40;
  dattyp in_stack_fffffffffffffc4c;
  runcxdef *in_stack_fffffffffffffc50;
  undefined8 uVar6;
  int in_stack_fffffffffffffd78;
  objnum in_stack_fffffffffffffd7e;
  runcxdef *in_stack_fffffffffffffd80;
  char *local_270;
  int local_268;
  size_t local_250;
  undefined1 *local_248;
  int local_23c;
  undefined1 local_238 [2];
  undefined1 local_236 [526];
  undefined8 *local_28;
  int local_1c;
  long local_18;
  undefined8 *local_10;
  int local_4;
  
  if (*(short *)((long)in_RDI + 0x10e4) == -1) {
    local_4 = 0;
  }
  else {
    local_248 = local_236;
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    for (local_23c = 0; local_23c < local_1c; local_23c = local_23c + 1) {
      bVar5 = **(char **)(local_18 + (long)local_23c * 8) != '\"';
      if (bVar5) {
        local_270 = *(char **)(local_18 + (long)local_23c * 8);
        local_250 = strlen(local_270);
      }
      else {
        iVar3 = osrp2((void *)(*(long *)(local_18 + (long)local_23c * 8) + 1));
        local_250 = (size_t)(iVar3 + -2);
        local_270 = (char *)(*(long *)(local_18 + (long)local_23c * 8) + 3);
      }
      bVar5 = !bVar5;
      *local_248 = 3;
      iVar3 = 0;
      if (bVar5) {
        iVar3 = 2;
      }
      oswp2(local_248 + 1,(int)local_250 + 2 + iVar3);
      puVar4 = local_248 + 3;
      if (bVar5) {
        local_248[3] = 0x22;
        puVar4 = local_248 + 4;
      }
      local_248 = puVar4;
      memcpy(local_248,local_270,local_250);
      puVar4 = local_248 + local_250;
      local_248 = puVar4;
      if (bVar5) {
        local_248 = puVar4 + 1;
        *puVar4 = 0x22;
      }
    }
    oswp2(local_238,(int)local_248 - (int)local_238);
    runpush(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,(runsdef *)in_stack_fffffffffffffc40
           );
    local_268 = 0;
    iVar3 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffcc0);
    if (iVar3 == 0) {
      uVar6 = *(undefined8 *)*local_10;
      *(undefined1 **)*local_10 = &stack0xfffffffffffffc50;
      runfn(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78);
      *(undefined8 *)*local_10 = uVar6;
    }
    else {
      *(runcxdef **)*local_10 = in_stack_fffffffffffffc50;
      local_268 = iVar3;
      if ((1 < iVar3 - 0x3f5U) && (iVar3 != 0x3fb)) {
        errrse1(in_stack_fffffffffffffc40,
                (errdef *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      }
    }
    if (local_268 == 0) {
      cVar1 = *(char *)(*(long *)(local_10[2] + 0x20) + -0x10);
      if (cVar1 == '\a') {
        lVar2 = *(long *)(local_10[2] + 0x20);
        *(long *)(local_10[2] + 0x20) = lVar2 + -0x10;
        if (*(char *)(lVar2 + -0x10) != '\a') {
          *(undefined4 *)(**(long **)local_10[2] + 0x68) = 0;
          runsign((runcxdef *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
        }
        *local_28 = *(undefined8 *)(*(long *)(local_10[2] + 0x20) + 8);
        local_4 = 30000;
      }
      else {
        *(long *)(local_10[2] + 0x20) = *(long *)(local_10[2] + 0x20) + -0x10;
        if (cVar1 == '\x05') {
          local_4 = 0x7531;
        }
        else {
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = local_268;
    }
  }
  return local_4;
}

Assistant:

int try_preparse_cmd(voccxdef *ctx, char **cmd, int wrdcnt,
                     uchar **preparse_list)
{
    uchar    listbuf[VOCBUFSIZ + 2 + 3*VOCBUFSIZ];
    int      i;
    uchar   *p;
    size_t   len;
    runsdef  val;
    int      typ;
    int      err;

    /* if there's no preparseCmd, keep processing */
    if (ctx->voccxppc == MCMONINV)
        return 0;
    
    /* build a list of the words */
    for (p = listbuf + 2, i = 0 ; i < wrdcnt ; ++i)
    {
        char *src;
        int add_quote;
        
        /* check for strings - they require special handling */
        if (cmd[i][0] == '"')
        {
            /* 
             *   it's a string - what follows is a run-time style string,
             *   with a length prefix followed by the text of the string 
             */
            len = osrp2(cmd[i] + 1) - 2;
            src = cmd[i] + 3;

            /* add quotes to the result */
            add_quote = TRUE;
        }
        else
        {
            /* ordinary word - copy directly */
            src = (char *)cmd[i];

            /* it's a null-terminated string */
            len = strlen(src);

            /* don't add quotes to the result */
            add_quote = FALSE;
        }

        /* write the type prefix */
        *p++ = DAT_SSTRING;

        /* write the length prefix */
        oswp2(p, len + 2 + (add_quote ? 2 : 0));
        p += 2;

        /* add an open quote if necessary */
        if (add_quote)
            *p++ = '"';

        /* copy the text */
        memcpy(p, src, len);
        p += len;

        /* add the closing quote if necessary */
        if (add_quote)
            *p++ = '"';
    }
    
    /* set the length of the whole list */
    len = p - listbuf;
    oswp2(listbuf, len);
    
    /* push the list as the argument, and call the user's preparseCmd */
    val.runstyp = DAT_LIST;
    val.runsv.runsvstr = listbuf;
    runpush(ctx->voccxrun, DAT_LIST, &val);

    /* presume that no error will occur */
    err = 0;

    /* catch errors that occur within preparseCmd */
    ERRBEGIN(ctx->voccxerr)
    {
        /* call preparseCmd */
        runfn(ctx->voccxrun, ctx->voccxppc, 1);
    }
    ERRCATCH(ctx->voccxerr, err)
    {
        /* 
         *   if it's abort/exit/exitobj, just return it; for any other
         *   errors, just re-throw the same error 
         */
        switch(err)
        {
        case ERR_RUNABRT:
        case ERR_RUNEXIT:
        case ERR_RUNEXITOBJ:
            /* simply return these errors to the caller */
            break;

        default:
            /* re-throw anything else */
            errrse(ctx->voccxerr);
        }
    }
    ERREND(ctx->voccxerr);

    /* if an error occurred, return the error code */
    if (err != 0)
        return err;

    /* get the result */
    typ = runtostyp(ctx->voccxrun);
    
    /* if they returned a list, it's a new command to execute */
    if (typ == DAT_LIST)
    {
        /* get the list and give it to the caller */
        *preparse_list = runpoplst(ctx->voccxrun);
        
        /* 
         *   indicate that the command is to be reparsed with the new word
         *   list 
         */
        return ERR_PREPRSCMDREDO;
    }

    /* for any other type, we don't need the value, so discard it */
    rundisc(ctx->voccxrun);

    /* if the result is nil, don't process this command further */
    if (typ == DAT_NIL)
        return ERR_PREPRSCMDCAN;
    else
        return 0;
}